

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::list
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *pCVar1;
  Url local_78;
  byte local_41;
  Url local_40;
  Path *local_20;
  Path *path_local;
  KeyValue *this_local;
  
  local_41 = 0;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  if (this->version_ == v1) {
    pCVar1 = this->client_;
    getUrl(&local_40,this,path);
    local_41 = 1;
    HttpConsumer::list(__return_storage_ptr__,pCVar1,&local_40);
  }
  else {
    pCVar1 = this->client_;
    getMetadataUrl(&local_78,this,path);
    HttpConsumer::list(__return_storage_ptr__,pCVar1,&local_78);
    Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_78);
  }
  if ((local_41 & 1) != 0) {
    Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::list(const Vault::Path &path) {
  return version_ == KeyValue::Version::v1
             ? Vault::HttpConsumer::list(client_, getUrl(path))
             : Vault::HttpConsumer::list(client_, getMetadataUrl(path));
}